

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O2

void Pdr_ManCollectCone(Aig_Man_t *pAig,Vec_Int_t *vCoObjs,Vec_Int_t *vCiObjs,Vec_Int_t *vNodes)

{
  int i;
  Aig_Obj_t *pObj;
  int i_00;
  
  vCiObjs->nSize = 0;
  vNodes->nSize = 0;
  Aig_ManIncrementTravId(pAig);
  pAig->pConst1->TravId = pAig->nTravIds;
  for (i_00 = 0; i_00 < vCoObjs->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vCoObjs,i_00);
    pObj = Aig_ManObj(pAig,i);
    Pdr_ManCollectCone_rec(pAig,pObj,vCiObjs,vNodes);
  }
  return;
}

Assistant:

void Pdr_ManCollectCone( Aig_Man_t * pAig, Vec_Int_t * vCoObjs, Vec_Int_t * vCiObjs, Vec_Int_t * vNodes )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_IntClear( vCiObjs );
    Vec_IntClear( vNodes );
    Aig_ManIncrementTravId( pAig );
    Aig_ObjSetTravIdCurrent( pAig, Aig_ManConst1(pAig) );
    Aig_ManForEachObjVec( vCoObjs, pAig, pObj, i )
        Pdr_ManCollectCone_rec( pAig, pObj, vCiObjs, vNodes );
}